

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaFormatFacetEnumSet
                    (xmlSchemaAbstractCtxtPtr actxt,xmlChar **buf,xmlSchemaTypePtr type)

{
  bool bVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int found;
  int res;
  xmlChar *value;
  int *piStack_30;
  xmlSchemaWhitespaceValueType ws;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypePtr type_local;
  xmlChar **buf_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  _found = (xmlChar *)0x0;
  bVar1 = false;
  facet = (xmlSchemaFacetPtr)type;
  type_local = (xmlSchemaTypePtr)buf;
  buf_local = (xmlChar **)actxt;
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
  }
  *(undefined8 *)type_local = 0;
  do {
    value._4_4_ = xmlSchemaGetWhiteSpaceFacetValue((xmlSchemaTypePtr)facet[1].node);
    for (piStack_30 = *(int **)&facet[1].fixed; piStack_30 != (int *)0x0;
        piStack_30 = *(int **)(piStack_30 + 2)) {
      if (*piStack_30 == 0x3ef) {
        bVar1 = true;
        iVar2 = xmlSchemaGetCanonValueWhtspExt
                          (*(xmlSchemaValPtr *)(piStack_30 + 0xe),value._4_4_,(xmlChar **)&found);
        if (iVar2 == -1) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)buf_local,"xmlSchemaFormatFacetEnumSet",
                     "compute the canonical lexical representation");
          if (*(long *)type_local != 0) {
            (*xmlFree)(*(void **)type_local);
          }
          *(undefined8 *)type_local = 0;
          return (xmlChar *)0x0;
        }
        if (*(long *)type_local == 0) {
          pxVar3 = xmlStrdup("\'");
          *(xmlChar **)type_local = pxVar3;
        }
        else {
          pxVar3 = xmlStrcat(*(xmlChar **)type_local,(xmlChar *)", \'");
          *(xmlChar **)type_local = pxVar3;
        }
        pxVar3 = xmlStrcat(*(xmlChar **)type_local,_found);
        *(xmlChar **)type_local = pxVar3;
        pxVar3 = xmlStrcat(*(xmlChar **)type_local,"\'");
        *(xmlChar **)type_local = pxVar3;
        if (_found != (xmlChar *)0x0) {
          (*xmlFree)(_found);
          _found = (xmlChar *)0x0;
        }
      }
    }
    if (bVar1) break;
    facet = (xmlSchemaFacetPtr)facet[1].node;
    bVar4 = false;
    if ((xmlNodePtr)facet != (xmlNodePtr)0x0) {
      bVar4 = *(xmlSchemaTypeType *)&((xmlNodePtr)facet)->_private != XML_SCHEMA_TYPE_BASIC;
    }
  } while (bVar4);
  return *(xmlChar **)type_local;
}

Assistant:

static const xmlChar *
xmlSchemaFormatFacetEnumSet(xmlSchemaAbstractCtxtPtr actxt,
			    xmlChar **buf, xmlSchemaTypePtr type)
{
    xmlSchemaFacetPtr facet;
    xmlSchemaWhitespaceValueType ws;
    xmlChar *value = NULL;
    int res, found = 0;

    if (*buf != NULL)
	xmlFree(*buf);
    *buf = NULL;

    do {
	/*
	* Use the whitespace type of the base type.
	*/
	ws = xmlSchemaGetWhiteSpaceFacetValue(type->baseType);
	for (facet = type->facets; facet != NULL; facet = facet->next) {
	    if (facet->type != XML_SCHEMA_FACET_ENUMERATION)
		continue;
	    found = 1;
	    res = xmlSchemaGetCanonValueWhtspExt(facet->val,
		ws, &value);
	    if (res == -1) {
		xmlSchemaInternalErr(actxt,
		    "xmlSchemaFormatFacetEnumSet",
		    "compute the canonical lexical representation");
		if (*buf != NULL)
		    xmlFree(*buf);
		*buf = NULL;
		return (NULL);
	    }
	    if (*buf == NULL)
		*buf = xmlStrdup(BAD_CAST "'");
	    else
		*buf = xmlStrcat(*buf, BAD_CAST ", '");
	    *buf = xmlStrcat(*buf, BAD_CAST value);
	    *buf = xmlStrcat(*buf, BAD_CAST "'");
	    if (value != NULL) {
		xmlFree((xmlChar *)value);
		value = NULL;
	    }
	}
	/*
	* The enumeration facet of a type restricts the enumeration
	* facet of the ancestor type; i.e., such restricted enumerations
	* do not belong to the set of the given type. Thus we break
	* on the first found enumeration.
	*/
	if (found)
	    break;
	type = type->baseType;
    } while ((type != NULL) && (type->type != XML_SCHEMA_TYPE_BASIC));

    return ((const xmlChar *) *buf);
}